

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O1

void __thiscall
MonahanPlanner::PlanWithCache(MonahanPlanner *this,string *filenameCache,bool computeIfNotCached)

{
  uint uVar1;
  pointer pcVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ifstream fp;
  long *local_270 [2];
  long local_260 [2];
  long local_250;
  long local_248;
  long local_230 [2];
  ostream local_220 [16];
  uint auStack_210 [122];
  
  if (this->_m_initialized == false) {
    (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[3])(this);
  }
  pcVar2 = (filenameCache->_M_dataplus)._M_p;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,pcVar2,pcVar2 + filenameCache->_M_string_length);
  std::__cxx11::string::append((char *)local_270);
  std::ifstream::ifstream(local_230,(char *)local_270[0],_S_in);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  uVar1 = *(uint *)((long)auStack_210 + *(long *)(local_230[0] + -0x18));
  std::ifstream::~ifstream(local_230);
  if ((uVar1 & 5) == 0 || computeIfNotCached) {
    if ((uVar1 & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"MonahanPlanner: loading cached ",0x1f);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(filenameCache->_M_dataplus)._M_p,
                          filenameCache->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      Load(this,filenameCache);
    }
    else {
      (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[4])(this);
      AlphaVectorPlanning::ExportValueFunction(filenameCache,&this->_m_qFunction,true);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_230);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_220,"MonahanPlanner::PlanWithCache: ",0x1f);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_220,(filenameCache->_M_dataplus)._M_p,filenameCache->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," not cached, bailing out",0x18);
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = &PTR__E_0059bd80;
  puVar4[1] = puVar4 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar4 + 1),local_250,local_248 + local_250);
  __cxa_throw(puVar4,&E::typeinfo,E::~E);
}

Assistant:

void MonahanPlanner::PlanWithCache(const string &filenameCache,
                                   bool computeIfNotCached)
{
    if(!_m_initialized)
        Initialize();

    bool cached;

    {
        ifstream fp(string(filenameCache + "_t0").c_str());
        if(!fp)
            cached=false;
        else
            cached=true;
    }

    if(!cached && !computeIfNotCached)
    {
        stringstream ss;
        ss << "MonahanPlanner::PlanWithCache: "
           << filenameCache << " not cached, bailing out";
        throw(E(ss.str()));
        return;
    }

    // Couldn't open cache file, so compute
    if(!cached)
    {
        Plan();
        Save(filenameCache);
    }
    else 
    {
        cout << "MonahanPlanner: loading cached " << filenameCache
             << endl;
        Load(filenameCache);
    }
}